

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap_unittest.cc
# Opt level: O2

void TestMap<TCMalloc_PageMap2<20>>(int limit,bool limit_is_below_the_overflow_boundary)

{
  ulong uVar1;
  code *pcVar2;
  undefined1 __first [8];
  undefined8 __last;
  bool bVar3;
  uint uVar4;
  _func_void_ptr_size_t *p_Var5;
  _func_void_ptr_size_t *p_Var6;
  char *pcVar7;
  undefined1 local_2088 [8];
  TCMalloc_PageMap2<20> map;
  AssertHelper local_70;
  undefined1 auStack_68 [8];
  AssertionResult gtest_ar;
  bool local_49;
  internal iStack_48;
  undefined7 uStack_47;
  bool limit_is_below_the_overflow_boundary_local;
  AssertionResult gtest_ar_5;
  
  local_49 = limit_is_below_the_overflow_boundary;
  printf("Running test with %d iterations...\n");
  map.root_[0x3ff] = (Leaf *)malloc;
  memset(local_2088,0,0x2000);
  map.allocator_ = (_func_void_ptr_size_t *)(long)limit;
  p_Var5 = (_func_void_ptr_size_t *)0x0;
  if (0 < (long)map.allocator_) {
    p_Var5 = map.allocator_;
  }
  p_Var6 = (_func_void_ptr_size_t *)0x0;
  while (p_Var5 != p_Var6) {
    TCMalloc_PageMap2<20>::Ensure((TCMalloc_PageMap2<20> *)local_2088,(Number)p_Var6,1);
    pcVar2 = p_Var6 + 1;
    uVar4 = (uint)p_Var6 & 0x3ff;
    map.root_[((ulong)p_Var6 >> 10) - 1]->values[uVar4] = pcVar2;
    if ((p_Var6 < (_func_void_ptr_size_t *)0x100000) &&
       (map.root_[((ulong)p_Var6 >> 10) - 1] != (Leaf *)0x0)) {
      _iStack_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   map.root_[((ulong)p_Var6 >> 10) - 1]->values[uVar4];
    }
    else {
      _iStack_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    gtest_ar_5.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )pcVar2;
    testing::internal::CmpHelperEQ<void*,void*>
              ((internal *)auStack_68,"map.get(i)","(void*)(i+1)",(void **)&stack0xffffffffffffffb8,
               (void **)&gtest_ar_5.message_);
    if (auStack_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      if (gtest_ar._0_8_ == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                 ,0x3b,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_5.message_,(Message *)&stack0xffffffffffffffb8);
      goto LAB_00109564;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    p_Var6 = pcVar2;
  }
  p_Var6 = (_func_void_ptr_size_t *)0x0;
  while (p_Var5 != p_Var6) {
    if ((p_Var6 < (_func_void_ptr_size_t *)0x100000) &&
       (map.root_[((ulong)p_Var6 >> 10) - 1] != (Leaf *)0x0)) {
      _iStack_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   map.root_[((ulong)p_Var6 >> 10) - 1]->values[(uint)p_Var6 & 0x3ff];
    }
    else {
      _iStack_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    p_Var6 = p_Var6 + 1;
    gtest_ar_5.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )p_Var6;
    testing::internal::CmpHelperEQ<void*,void*>
              ((internal *)auStack_68,"map.get(i)","(void*)(i+1)",(void **)&stack0xffffffffffffffb8,
               (void **)&gtest_ar_5.message_);
    if (auStack_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      if (gtest_ar._0_8_ == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                 ,0x3e,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_5.message_,(Message *)&stack0xffffffffffffffb8);
      goto LAB_00109564;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
  }
  map.root_[0x3ff] = (Leaf *)malloc;
  memset((TCMalloc_PageMap2<20> *)local_2088,0,0x2000);
  TCMalloc_PageMap2<20>::Ensure((TCMalloc_PageMap2<20> *)local_2088,0,(size_t)map.allocator_);
  p_Var6 = (_func_void_ptr_size_t *)0x0;
  while (p_Var5 != p_Var6) {
    pcVar2 = p_Var6 + 1;
    uVar4 = (uint)p_Var6 & 0x3ff;
    map.root_[((ulong)p_Var6 >> 10) - 1]->values[uVar4] = pcVar2;
    if ((p_Var6 < (_func_void_ptr_size_t *)0x100000) &&
       (map.root_[((ulong)p_Var6 >> 10) - 1] != (Leaf *)0x0)) {
      _iStack_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   map.root_[((ulong)p_Var6 >> 10) - 1]->values[uVar4];
    }
    else {
      _iStack_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    gtest_ar_5.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )pcVar2;
    testing::internal::CmpHelperEQ<void*,void*>
              ((internal *)auStack_68,"map.get(i)","(void*)(i+1)",(void **)&stack0xffffffffffffffb8,
               (void **)&gtest_ar_5.message_);
    if (auStack_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      if (gtest_ar._0_8_ == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                 ,0x47,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_5.message_,(Message *)&stack0xffffffffffffffb8);
      goto LAB_00109564;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    p_Var6 = pcVar2;
  }
  p_Var6 = (_func_void_ptr_size_t *)0x0;
  while (p_Var5 != p_Var6) {
    if ((p_Var6 < (_func_void_ptr_size_t *)0x100000) &&
       (map.root_[((ulong)p_Var6 >> 10) - 1] != (Leaf *)0x0)) {
      _iStack_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   map.root_[((ulong)p_Var6 >> 10) - 1]->values[(uint)p_Var6 & 0x3ff];
    }
    else {
      _iStack_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    p_Var6 = p_Var6 + 1;
    gtest_ar_5.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )p_Var6;
    testing::internal::CmpHelperEQ<void*,void*>
              ((internal *)auStack_68,"map.get(i)","(void*)(i+1)",(void **)&stack0xffffffffffffffb8,
               (void **)&gtest_ar_5.message_);
    if (auStack_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      if (gtest_ar._0_8_ == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                 ,0x4a,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_5.message_,(Message *)&stack0xffffffffffffffb8);
LAB_00109564:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      if (_iStack_48 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)_iStack_48 + 8))();
      }
      goto LAB_00109580;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
  }
  map.root_[0x3ff] = (Leaf *)malloc;
  memset((TCMalloc_PageMap2<20> *)local_2088,0,0x2000);
  p_Var6 = map.allocator_;
  bVar3 = TCMalloc_PageMap2<20>::Ensure
                    ((TCMalloc_PageMap2<20> *)local_2088,(Number)map.allocator_,
                     (long)((int)map.allocator_ + 1));
  iStack_48 = (internal)bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)auStack_68,"map.Ensure(limit, limit+1)",
             "limit_is_below_the_overflow_boundary",(bool *)&stack0xffffffffffffffb8,&local_49);
  if (auStack_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffb8);
    if (gtest_ar._0_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
               ,0x51,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_5.message_,(Message *)&stack0xffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    if (_iStack_48 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      (**(code **)(*(long *)_iStack_48 + 8))();
    }
LAB_00109580:
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    return;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  auStack_68 = (undefined1  [8])0x0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  for (local_2088 = (undefined1  [8])0x0; __last = gtest_ar._0_8_, __first = auStack_68,
      (long)local_2088 < (long)p_Var6; local_2088 = (undefined1  [8])((long)(void **)local_2088 + 1)
      ) {
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)auStack_68,(value_type_conflict *)local_2088);
  }
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)local_2088,0x2a);
  std::
  shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)__first,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)__last,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2088);
  map.root_[0x3ff] = (Leaf *)malloc;
  memset(local_2088,0,0x2000);
  for (p_Var6 = (_func_void_ptr_size_t *)0x0; p_Var5 != p_Var6; p_Var6 = p_Var6 + 1) {
    TCMalloc_PageMap2<20>::Ensure
              ((TCMalloc_PageMap2<20> *)local_2088,*(Number *)((long)auStack_68 + p_Var6 * 8),1);
    uVar1 = *(ulong *)((long)auStack_68 + p_Var6 * 8);
    map.root_[(uVar1 >> 10) - 1]->values[(uint)uVar1 & 0x3ff] = (void *)(uVar1 + 1);
    uVar1 = *(ulong *)((long)auStack_68 + p_Var6 * 8);
    if ((uVar1 < 0x100000) && (map.root_[(uVar1 >> 10) - 1] != (Leaf *)0x0)) {
      gtest_ar_5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )map.root_[(uVar1 >> 10) - 1]->values[(uint)uVar1 & 0x3ff];
    }
    else {
      gtest_ar_5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
    }
    local_70.data_ = (AssertHelperData *)(uVar1 + 1);
    testing::internal::CmpHelperEQ<void*,void*>
              (&stack0xffffffffffffffb8,"map.get(elements[i])","(void*)(elements[i]+1)",
               (void **)&gtest_ar_5.message_,&local_70.data_);
    if (iStack_48 == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar_5.message_);
      if (gtest_ar_5._0_8_ == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)gtest_ar_5._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                 ,0x5d,pcVar7);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_5.message_);
      goto LAB_001096e9;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_5);
  }
  p_Var6 = (_func_void_ptr_size_t *)0x0;
  while( true ) {
    if (p_Var5 == p_Var6) goto LAB_0010970a;
    if ((p_Var6 < (_func_void_ptr_size_t *)0x100000) &&
       (map.root_[((ulong)p_Var6 >> 10) - 1] != (Leaf *)0x0)) {
      gtest_ar_5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )map.root_[((ulong)p_Var6 >> 10) - 1]->values[(uint)p_Var6 & 0x3ff];
    }
    else {
      gtest_ar_5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
    }
    p_Var6 = p_Var6 + 1;
    local_70.data_ = (AssertHelperData *)p_Var6;
    testing::internal::CmpHelperEQ<void*,void*>
              (&stack0xffffffffffffffb8,"map.get(i)","(void*)(i+1)",(void **)&gtest_ar_5.message_,
               &local_70.data_);
    if (iStack_48 == (internal)0x0) break;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_5);
  }
  testing::Message::Message((Message *)&gtest_ar_5.message_);
  if (gtest_ar_5._0_8_ == 0) {
    pcVar7 = "";
  }
  else {
    pcVar7 = *(char **)gtest_ar_5._0_8_;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
             ,0x60,pcVar7);
  testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_5.message_);
LAB_001096e9:
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar_5.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(long *)gtest_ar_5.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_5);
LAB_0010970a:
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)auStack_68);
  return;
}

Assistant:

void TestMap(int limit, bool limit_is_below_the_overflow_boundary) {
  printf("Running test with %d iterations...\n", limit);

  { // Test sequential ensure/assignment
    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(i, 1);
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  { // Test bulk Ensure
    Type map(malloc);
    map.Ensure(0, limit);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  // Test that we correctly notice overflow
  {
    Type map(malloc);
    ASSERT_EQ(map.Ensure(limit, limit+1), limit_is_below_the_overflow_boundary);
  }

  { // Test randomized accesses
    std::vector<intptr_t> elements;
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) elements.push_back(i);
    std::shuffle(elements.begin(), elements.end(), std::mt19937(42));

    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(elements[i], 1);
      map.set(elements[i], (void*)(elements[i]+1));
      ASSERT_EQ(map.get(elements[i]), (void*)(elements[i]+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }
}